

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  iterator this_00;
  unique_lock<std::mutex> *in_RDI;
  thread *worker;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_28 [5];
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
  *(undefined1 *)&in_RDI[0xc]._M_device = 1;
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  std::condition_variable::notify_all();
  local_28[0]._M_current =
       (thread *)
       std::vector<std::thread,_std::allocator<std::thread>_>::begin
                 ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffffb8);
  this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::end
                      ((vector<std::thread,_std::allocator<std::thread>_> *)
                       in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(local_28);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(local_28);
  }
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 9));
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            *)0x116fb9);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)this_00._M_current);
  return;
}

Assistant:

~ThreadPool()
  {
    {
      std::unique_lock<std::mutex> lock(queue_mutex);
      stop = true;
    }
    condition.notify_all();
    for (std::thread & worker : workers) {
      worker.join();
    }
  }